

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  pointer pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  pointer pcVar3;
  pointer pbVar4;
  ulong uVar5;
  char *pcVar6;
  pointer ppcVar7;
  ModuleDefinitionInfo *pMVar8;
  int iVar9;
  string *psVar10;
  ostream *poVar11;
  string *obj_1;
  pointer pbVar12;
  string *obj;
  pointer ppcVar13;
  string objlist_file;
  string cmd;
  cmGeneratedFileStream fout;
  string local_2e0;
  ModuleDefinitionInfo *local_2c0;
  string local_2b8;
  string local_298;
  undefined1 local_278 [584];
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  psVar10 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  local_2c0 = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,psVar10);
  if ((local_2c0 != (ModuleDefinitionInfo *)0x0) && (local_2c0->DefFileGenerated == true)) {
    psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    pcVar1 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,pcVar1,pcVar1 + psVar10->_M_string_length);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_278,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2b8,SHELL);
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_278);
    pcVar1 = local_278 + 0x10;
    if ((pointer)local_278._0_8_ != pcVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    std::__cxx11::string::append((char *)&local_2b8);
    pcVar2 = this->LocalGenerator;
    psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_2e0,(cmLocalGenerator *)pcVar2,psVar10,&local_2c0->DefFile);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_278,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2e0,SHELL);
    std::__cxx11::string::_M_append((char *)&local_2b8,local_278._0_8_);
    if ((pointer)local_278._0_8_ != pcVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_2b8);
    pMVar8 = local_2c0;
    pcVar3 = (local_2c0->DefFile)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar3,pcVar3 + (local_2c0->DefFile)._M_string_length);
    std::__cxx11::string::append((char *)&local_2e0);
    pcVar2 = this->LocalGenerator;
    psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_298,(cmLocalGenerator *)pcVar2,psVar10,&local_2e0);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_278,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_298,SHELL);
    std::__cxx11::string::_M_append((char *)&local_2b8,local_278._0_8_);
    if ((pointer)local_278._0_8_ != pcVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(real_link_commands,
             (real_link_commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_2b8);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,&local_2e0,false,None);
    if (pMVar8->WindowsExportAllSymbols == true) {
      pbVar4 = (this->Objects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = (this->Objects).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar4;
          pbVar12 = pbVar12 + 1) {
        uVar5 = pbVar12->_M_string_length;
        if (3 < uVar5) {
          pcVar6 = (pbVar12->_M_dataplus)._M_p;
          iVar9 = strcmp(pcVar6 + (uVar5 - 4),".obj");
          if (iVar9 == 0) {
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_278,pcVar6,uVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          }
        }
      }
      pbVar12 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar12 != pbVar4) {
        do {
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,(pbVar12->_M_dataplus)._M_p,
                               pbVar12->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != pbVar4);
      }
    }
    ppcVar13 = (local_2c0->Sources).
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppcVar7 = (local_2c0->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar13 != ppcVar7) {
      do {
        psVar10 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar13);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(psVar10->_M_dataplus)._M_p,
                             psVar10->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        ppcVar13 = ppcVar13 + 1;
      } while (ppcVar13 != ppcVar7);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd =
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
  cmd += " -E __create_def ";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), mdi->DefFile),
    cmOutputConverter::SHELL);
  cmd += " ";
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), objlist_file),
    cmOutputConverter::SHELL);
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}